

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O2

void __thiscall QtMWidgets::PageControl::setCount(PageControl *this,int c)

{
  int iVar1;
  PageControlPrivate *pPVar2;
  QRect QVar3;
  QRect local_28;
  
  if ((-1 < c) && (pPVar2 = (this->d).d, pPVar2->count != c)) {
    pPVar2->count = c;
    QVar3 = QWidget::rect(&this->super_QWidget);
    PageControlPrivate::updateButtonsInfo(pPVar2,(QVar3.x2 - QVar3.x1) + 1);
    QList<QRect>::clear(&((this->d).d)->rectangles);
    pPVar2 = (this->d).d;
    if ((long)pPVar2->count < 1) {
      iVar1 = pPVar2->currentIndex;
      pPVar2->currentIndex = -1;
      currentChanged(this,-1,iVar1);
      return;
    }
    QList<QRect>::reserve(&pPVar2->rectangles,(long)pPVar2->count);
    pPVar2 = (this->d).d;
    local_28.x1 = 0;
    local_28.y1 = 0;
    local_28.x2 = -1;
    local_28.y2 = -1;
    QList<QRect>::fill(&pPVar2->rectangles,&local_28,(long)pPVar2->count);
    PageControlPrivate::updateButtonsGeometry((this->d).d);
    pPVar2 = (this->d).d;
    iVar1 = pPVar2->count;
    if (iVar1 <= pPVar2->currentIndex) {
      setCurrentIndex(this,iVar1 + -1);
    }
  }
  return;
}

Assistant:

void
PageControl::setCount( int c )
{
	if( d->count != c && c >= 0 )
	{
		d->count = c;

		d->updateButtonsInfo( rect().width() );

		d->rectangles.clear();

		if( d->count > 0 )
		{
			d->rectangles.reserve( d->count );

			d->rectangles.fill( QRect(), d->count );

			d->updateButtonsGeometry();

			if( d->currentIndex >= d->count )
				setCurrentIndex( d->count - 1 );
		}
		else
		{
			const int prev = d->currentIndex;

			d->currentIndex = -1;

			emit currentChanged( d->currentIndex, prev );
		}
	}
}